

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec<3,_float,_(glm::qualifier)0> local_38;
  vec<3,_float,_(glm::qualifier)0> local_28;
  
  dVar1 = cos((double)(this->Yaw * 0.017453292));
  dVar2 = cos((double)(this->Pitch * 0.017453292));
  dVar3 = sin((double)(this->Pitch * 0.017453292));
  local_28.field_1.y = (float)dVar3;
  local_28.field_0.x = (float)(dVar2 * dVar1);
  dVar1 = sin((double)(this->Yaw * 0.017453292));
  dVar2 = cos((double)(this->Pitch * 0.017453292));
  local_28.field_2.z = (float)(dVar2 * dVar1);
  vVar4 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_28);
  (this->Front).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar4._0_8_;
  (this->Front).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar4._0_8_ >> 0x20);
  (this->Front).field_2 = vVar4.field_2;
  vVar4 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                    (&this->Front,&this->WorldUp);
  local_38.field_2 = vVar4.field_2;
  local_38._0_8_ = vVar4._0_8_;
  vVar4 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_38);
  (this->Right).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar4._0_8_;
  (this->Right).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar4._0_8_ >> 0x20);
  (this->Right).field_2 = vVar4.field_2;
  vVar4 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                    (&this->Right,&this->Front);
  local_38.field_2 = vVar4.field_2;
  local_38._0_8_ = vVar4._0_8_;
  vVar4 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_38);
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar4._0_8_;
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar4._0_8_ >> 0x20);
  (this->Up).field_2 = vVar4.field_2;
  return;
}

Assistant:

void updateCameraVectors() {
        // Calculate the new Front vector
        glm::vec3 front;
        front.x = cos(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        front.y = sin(glm::radians(this->Pitch));
        front.z = sin(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        // Normalize the vectors, because their length gets closer to 0 the more you look up or down
        // which results in slower movement.
        this->Front = glm::normalize(front);
        // Also re-calculate the Right and Up vector
        this->Right = glm::normalize(glm::cross(this->Front, this->WorldUp));
        this->Up = glm::normalize(glm::cross(this->Right, this->Front));
    }